

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

char * __thiscall spvc_context_s::allocate_name(spvc_context_s *this,string *name)

{
  char *pcVar1;
  exception *e;
  char *ret;
  undefined1 local_28 [8];
  unique_ptr<StringAllocation,_std::default_delete<StringAllocation>_> alloc;
  string *name_local;
  spvc_context_s *this_local;
  
  alloc._M_t.super___uniq_ptr_impl<StringAllocation,_std::default_delete<StringAllocation>_>._M_t.
  super__Tuple_impl<0UL,_StringAllocation_*,_std::default_delete<StringAllocation>_>.
  super__Head_base<0UL,_StringAllocation_*,_false>._M_head_impl =
       (__uniq_ptr_data<StringAllocation,_std::default_delete<StringAllocation>,_true,_true>)
       (__uniq_ptr_data<StringAllocation,_std::default_delete<StringAllocation>,_true,_true>)name;
  spvc_allocate<StringAllocation,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::unique_ptr<StringAllocation,_std::default_delete<StringAllocation>_>::operator->
            ((unique_ptr<StringAllocation,_std::default_delete<StringAllocation>_> *)local_28);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>,8ul>
  ::emplace_back<std::unique_ptr<StringAllocation,std::default_delete<StringAllocation>>>
            ((SmallVector<std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>,8ul>
              *)&this->allocations,
             (unique_ptr<StringAllocation,_std::default_delete<StringAllocation>_> *)local_28);
  std::unique_ptr<StringAllocation,_std::default_delete<StringAllocation>_>::~unique_ptr
            ((unique_ptr<StringAllocation,_std::default_delete<StringAllocation>_> *)local_28);
  return pcVar1;
}

Assistant:

const char *spvc_context_s::allocate_name(const std::string &name)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto alloc = spvc_allocate<StringAllocation>(name);
		auto *ret = alloc->str.c_str();
		allocations.emplace_back(std::move(alloc));
		return ret;
	}